

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubBoard.cpp
# Opt level: O3

Chunk * __thiscall SubBoard::accessChunk(SubBoard *this,repr coords)

{
  source_loc loc;
  _Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false> _Var1;
  logger *this_00;
  ChunkDrawable *this_01;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>,_bool>
  pVar2;
  string_view_t fmt;
  pair<int,_int> local_60;
  ulong local_58;
  LodRenderer *local_50;
  pair<int,_int> local_48;
  LodRenderer **ppLStack_40;
  undefined8 local_38;
  
  local_58 = coords;
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->chunks_)._M_h,&local_58);
  if (_Var1._M_cur == (__node_type *)0x0) {
    local_60 = (pair<int,_int>)(local_58 ^ 0x8000000080000000);
    this_00 = spdlog::default_logger_raw();
    local_48.first = 0;
    local_48.second = 0;
    ppLStack_40 = (LodRenderer **)0x0;
    local_38 = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x24;
    fmt.data_ = "SubBoard allocating new chunk at {}.";
    spdlog::logger::log_<std::pair<int,int>>(this_00,loc,warn,fmt,&local_60);
    local_50 = &this->super_LodRenderer;
    ppLStack_40 = &local_50;
    local_60 = (pair<int,_int>)&local_58;
    local_48 = (pair<int,_int>)&local_58;
    pVar2 = std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,Chunk>,std::allocator<std::pair<unsigned_long_const,Chunk>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<LodRenderer*&&,unsigned_long&>>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Chunk>,std::allocator<std::pair<unsigned_long_const,Chunk>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->chunks_,&std::piecewise_construct,&local_60,&local_48);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur;
    this_01 = FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
                        (&this->chunkDrawables_,&local_58);
    ChunkDrawable::setChunk(this_01,(Chunk *)((long)_Var1._M_cur + 0x10));
  }
  return (Chunk *)((long)&((_Var1._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_Chunk>,_false>).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_Chunk>_>.
                          _M_storage._M_storage + 8);
}

Assistant:

Chunk& SubBoard::accessChunk(ChunkCoords::repr coords) {
    auto chunk = chunks_.find(coords);
    if (chunk != chunks_.end()) {
        return chunk->second;
    }

    spdlog::warn("SubBoard allocating new chunk at {}.", ChunkCoords::toPair(coords));
    chunk = chunks_.emplace(std::piecewise_construct, std::forward_as_tuple(coords), std::forward_as_tuple(static_cast<LodRenderer*>(this), coords)).first;
    chunkDrawables_[coords].setChunk(&chunk->second);
    return chunk->second;
}